

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block1394eth.cpp
# Opt level: O1

void PrintDebugStream(stringstream *debugStream)

{
  long *plVar1;
  size_t sVar2;
  char line [80];
  long *local_88 [2];
  long local_78 [2];
  char local_68 [80];
  
  std::ios::widen((char)*(undefined8 *)(*(long *)debugStream + -0x18) + (char)debugStream);
  plVar1 = (long *)std::istream::getline((char *)debugStream,(long)local_68,'P');
  if ((*(byte *)((long)plVar1 + *(long *)(*plVar1 + -0x18) + 0x20) & 5) == 0) {
    do {
      sVar2 = strlen(local_68);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,local_68,sVar2);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '8');
      std::ostream::put('8');
      std::ostream::flush();
      std::ios::widen((char)*(undefined8 *)(*(long *)debugStream + -0x18) + (char)debugStream);
      plVar1 = (long *)std::istream::getline((char *)debugStream,(long)local_68,'P');
    } while ((*(byte *)((long)plVar1 + *(long *)(*plVar1 + -0x18) + 0x20) & 5) == 0);
  }
  std::ios::clear((int)*(undefined8 *)(*(long *)debugStream + -0x18) + (int)debugStream);
  local_88[0] = local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"");
  std::__cxx11::stringbuf::str((string *)(debugStream + 0x18));
  if (local_88[0] != local_78) {
    operator_delete(local_88[0],local_78[0] + 1);
  }
  return;
}

Assistant:

void PrintDebugStream(std::stringstream &debugStream)
{
    char line[80];
    while (debugStream.getline(line, sizeof(line)))
        std::cerr << line << std::endl;
    debugStream.clear();
    debugStream.str("");
}